

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
__thiscall
mxx::gatherv<std::array<unsigned_long,4ul>>
          (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
           *__return_storage_ptr__,mxx *this,array<unsigned_long,_4UL> *data,size_t size,int root,
          comm *comm)

{
  undefined4 in_register_00000084;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  comm *in_stack_ffffffffffffffa8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  array<unsigned_long,_4UL> *local_38;
  
  local_38 = data;
  gather<unsigned_long>
            (&local_50,(unsigned_long *)&local_38,1,(int)size,
             (comm *)CONCAT44(in_register_00000084,root));
  gatherv<std::array<unsigned_long,4ul>>
            (__return_storage_ptr__,this,local_38,(size_t)&local_50,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(size & 0xffffffff),root,
             in_stack_ffffffffffffffa8);
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gatherv(const T* data, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    // recv_sizes is unknown -> first collect via gather
    std::vector<size_t> recv_sizes = gather(size, root, comm);
    return gatherv(data, size, recv_sizes, root, comm);
}